

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::CreateSettingsResourcePrefsFile(cmExtraEclipseCDT4Generator *this)

{
  cmMakefile *this_00;
  pointer pcVar1;
  cmValue cVar2;
  ostream *poVar3;
  string filename;
  cmGeneratedFileStream fout;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [616];
  
  this_00 = *(cmMakefile **)
             ((long)(((((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
                      LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t + 0x70);
  pcVar1 = (this->HomeOutputDirectory)._M_dataplus._M_p;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,pcVar1,pcVar1 + (this->HomeOutputDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&local_2c0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_280,&local_2c0,false,None);
  if (((byte)(*(_func_int **)(local_280._0_8_ + -0x18))[(long)(local_280 + 0x20)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_280,"eclipse.preferences.version=1\n",0x1e);
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"CMAKE_ECLIPSE_RESOURCE_ENCODING","");
    cVar2 = cmMakefile::GetDefinition(this_00,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if (cVar2.Value != (string *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_280,"encoding/<project>=",0x13);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_280,((cVar2.Value)->_M_dataplus)._M_p,
                          (cVar2.Value)->_M_string_length);
      local_2a0._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_2a0,1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSettingsResourcePrefsFile()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename =
    this->HomeOutputDirectory + "/.settings/org.eclipse.core.resources.prefs";

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "eclipse.preferences.version=1\n";
  cmValue encoding = mf->GetDefinition("CMAKE_ECLIPSE_RESOURCE_ENCODING");
  if (encoding) {
    fout << "encoding/<project>=" << *encoding << '\n';
  }
}